

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

string * __thiscall
pbrt::RealisticCamera::ToString_abi_cxx11_(string *__return_storage_ptr__,RealisticCamera *this)

{
  vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *in_R9;
  string sStack_38;
  
  CameraBase::ToString_abi_cxx11_(&sStack_38,&this->super_CameraBase);
  StringPrintf<std::__cxx11::string,pstd::vector<pbrt::RealisticCamera::LensElementInterface,pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>>const&,pstd::vector<pbrt::Bounds2<float>,pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>>>const&>
            (__return_storage_ptr__,
             (pbrt *)"[ RealisticCamera %s elementInterfaces: %s exitPupilBounds: %s ]",
             (char *)&sStack_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->elementInterfaces,
             (vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
              *)&this->exitPupilBounds,in_R9);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string RealisticCamera::ToString() const {
    return StringPrintf(
        "[ RealisticCamera %s elementInterfaces: %s exitPupilBounds: %s ]",
        CameraBase::ToString(), elementInterfaces, exitPupilBounds);
}